

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# command_line_interface_unittest.cc
# Opt level: O1

void __thiscall
google::protobuf::compiler::anon_unknown_0::
CommandLineInterfaceTest_EditionDefaultsDependencyManifest_Test::
~CommandLineInterfaceTest_EditionDefaultsDependencyManifest_Test
          (CommandLineInterfaceTest_EditionDefaultsDependencyManifest_Test *this)

{
  CommandLineInterfaceTester::~CommandLineInterfaceTester((CommandLineInterfaceTester *)this);
  operator_delete(this,0x2e8);
  return;
}

Assistant:

TEST_F(CommandLineInterfaceTest, EditionDefaultsDependencyManifest) {
  CreateTempFile("google/protobuf/descriptor.proto",
                 google::protobuf::DescriptorProto::descriptor()->file()->DebugString());
  CreateTempFile("features.proto",
                 pb::TestFeatures::descriptor()->file()->DebugString());

  Run("protocol_compiler --dependency_out=$tmpdir/manifest "
      "--edition_defaults_out=$tmpdir/defaults "
      "--proto_path=$tmpdir features.proto");

  ExpectNoErrors();

  ExpectFileContent(
      "manifest",
      "$tmpdir/defaults: "
      "$tmpdir/google/protobuf/descriptor.proto\\\n $tmpdir/features.proto");
}